

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_timeout.cpp
# Opt level: O1

void __thiscall tst_qpromise_timeout::rejectedStdChrono(tst_qpromise_timeout *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *pQVar3;
  anon_class_24_3_494f60a1 callback;
  long *plVar4;
  long *plVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar6;
  PromiseResolver<int> PVar7;
  _func_int **pp_Var8;
  char16_t *this_00;
  bool bVar9;
  char cVar10;
  long *plVar11;
  QSlotObjectBase *pQVar12;
  PromiseDataBase<void,_void_()> *this_01;
  PromiseData<int> *pPVar13;
  char *pcVar14;
  char *pcVar15;
  QPromiseReject<int> *in_R8;
  QByteArrayView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_170;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_168;
  QPromise<int> p;
  PromiseResolver<int> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_110;
  QPromise<int> local_108;
  qsizetype local_f8;
  QString local_f0;
  qint64 elapsed;
  QSharedData *local_c8;
  long *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  PromiseResolver<int> resolver_2;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined **local_58;
  QElapsedTimer timer;
  
  timer.t1 = -0x8000000000000000;
  timer.t2 = -0x8000000000000000;
  elapsed = -1;
  QElapsedTimer::start();
  plVar11 = (long *)operator_new(0x68);
  *plVar11 = 0;
  plVar11[1] = 0;
  plVar11[2] = 0;
  plVar11[3] = 0;
  plVar11[4] = 0;
  plVar11[5] = 0;
  plVar11[6] = 0;
  plVar11[7] = 0;
  plVar11[8] = 0;
  plVar11[9] = 0;
  plVar11[10] = 0;
  plVar11[0xb] = 0;
  plVar11[0xc] = 0;
  *plVar11 = (long)&PTR__PromiseDataBase_0011fb48;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(plVar11 + 2),0);
  *(undefined1 *)(plVar11 + 3) = 0;
  plVar11[4] = 0;
  plVar11[5] = 0;
  plVar11[6] = 0;
  plVar11[7] = 0;
  plVar11[8] = 0;
  plVar11[9] = 0;
  plVar11[10] = 0;
  *plVar11 = (long)&PTR__PromiseData_0011fad0;
  plVar11[0xb] = 0;
  plVar11[0xc] = 0;
  LOCK();
  *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
  UNLOCK();
  LOCK();
  *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
  UNLOCK();
  plVar4 = plVar11 + 1;
  local_168.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fa98;
  local_168.super__Function_base._M_functor._8_8_ = plVar11;
  local_c0 = plVar11;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_168);
  local_168.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fa68;
  if ((long *)local_168.super__Function_base._M_functor._8_8_ != (long *)0x0) {
    LOCK();
    plVar11 = (long *)(local_168.super__Function_base._M_functor._8_8_ + 8);
    *(int *)plVar11 = *(int *)plVar11 + -1;
    UNLOCK();
    if ((*(int *)plVar11 == 0) &&
       ((long *)local_168.super__Function_base._M_functor._8_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_168.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar7.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  pQVar12 = (QSlotObjectBase *)operator_new(0x18);
  if (PVar7.m_d.d == (Data *)0x0) {
    (pQVar12->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar12->m_impl =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp:138:43),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(undefined8 *)(pQVar12 + 1) = 0;
  }
  else {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
    (pQVar12->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar12->m_impl =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp:138:43),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)(pQVar12 + 1) =
         PVar7.m_d.d;
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
  }
  QTimer::singleShotImpl(1000,PreciseTimer,(QObject *)0x0,pQVar12);
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  plVar11 = local_c0;
  local_168.super__Function_base._M_functor._8_8_ = &local_58;
  local_58 = &PTR__QException_0011fa18;
  local_168.super__Function_base._M_functor._M_unused._M_object = &local_b8;
  local_b8._0_4_ = 2000;
  LOCK();
  *(int *)(local_c0 + 1) = (int)local_c0[1] + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011fa98;
  callback.error = (QPromiseTimeoutException *)local_168.super__Function_base._M_functor._8_8_;
  callback.msec = (int *)local_168.super__Function_base._M_functor._M_unused._0_8_;
  callback.p = (QPromise<int> *)&resolver;
  local_168.super__Function_base._M_manager = (_Manager_type)&resolver;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:122:24),_0>
            ((QPromiseBase<int> *)&local_f0,callback);
  local_f0.d.d = (Data *)&PTR__QPromiseBase_0011fa98;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011fa68;
  if (plVar11 != (long *)0x0) {
    LOCK();
    plVar5 = plVar11 + 1;
    *(int *)plVar5 = (int)*plVar5 + -1;
    UNLOCK();
    if (((int)*plVar5 == 0) && (plVar11 != (long *)0x0)) {
      (**(code **)(*plVar11 + 8))();
    }
  }
  this_00 = local_f0.d.ptr;
  if ((PromiseData<int> *)local_f0.d.ptr != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_f0.d.ptr)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011fcf0;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011fc88;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_c8 = &this_01->super_QSharedData;
  local_168.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fc20;
  local_168.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&resolver,(QPromise<void> *)&local_168);
  local_168.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fc68;
  if ((PromiseDataBase<void,_void_()> *)local_168.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_168.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_168.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_168.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar7.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x20);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_b8._M_unused._0_8_)->d = (Data *)PVar7.m_d.d;
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_b8._M_unused._0_8_ + 8))->d = (Data *)PVar7.m_d.d;
  if (PVar7.m_d.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_b8._M_unused._0_8_ + 0x10))->d = (Data *)&elapsed;
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_b8._M_unused._0_8_ + 0x18))->d = (Data *)&timer;
    pcStack_a0 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_b8._M_unused._0_8_ + 0x10))->d = (Data *)&elapsed;
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_b8._M_unused._0_8_ + 0x18))->d = (Data *)&timer;
    pcStack_a0 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            ((PromiseDataBase<int,_void_(const_int_&)> *)this_00,
             (function<void_(const_int_&)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x20);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_78._M_unused._0_8_)->d = (Data *)PVar7.m_d.d;
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_78._M_unused._0_8_ + 8))->d = (Data *)PVar7.m_d.d;
  if (PVar7.m_d.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_78._M_unused._0_8_ + 0x10))->d = (Data *)&elapsed;
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_78._M_unused._0_8_ + 0x18))->d = (Data *)&timer;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_78._M_unused._0_8_ + 0x10))->d = (Data *)&elapsed;
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_78._M_unused._0_8_ + 0x18))->d = (Data *)&timer;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            ((PromiseDataBase<int,_void_(const_int_&)> *)this_00,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    ((PromiseDataBase<int,_void_(const_int_&)> *)this_00);
  if (!bVar9) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              ((PromiseDataBase<int,_void_(const_int_&)> *)this_00);
  }
  pQVar1 = &((PromiseDataBase<int,_void_(const_int_&)> *)this_00)->super_QSharedData;
  LOCK();
  pQVar2 = &((PromiseDataBase<int,_void_(const_int_&)> *)this_00)->super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa68;
  pPVar13 = (PromiseData<int> *)operator_new(0x68);
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0011fb48;
  QReadWriteLock::QReadWriteLock
            (&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0011fad0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar13 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa98;
  p.super_QPromiseBase<int>.m_d.d = pPVar13;
  local_108.super_QPromiseBase<int>.m_d.d = pPVar13;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_2,&local_108);
  local_108.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa68;
  if (local_108.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((local_108.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_108.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_108.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  local_170 = resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  local_110 = resolver_2.m_d.d;
  local_168.super__Function_base._M_functor._M_unused._M_object = (void *)resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  local_168.super__Function_base._M_functor._8_8_ = resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  local_168._M_invoker = (_Invoker_type)this_00;
  LOCK();
  pQVar2 = &((PromiseDataBase<int,_void_(const_int_&)> *)this_00)->super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_168.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_0011fa98;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_168.super__Function_base._M_functor._M_unused._M_object;
  if ((Data *)local_168.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168.super__Function_base._M_functor._M_unused._0_8_ =
         *local_168.super__Function_base._M_functor._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise =
       (QPromise<int> *)local_168.super__Function_base._M_functor._8_8_;
  if ((Data *)local_168.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168.super__Function_base._M_functor._8_8_ =
         *(int *)local_168.super__Function_base._M_functor._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0011fa68;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<int> *)local_168._M_invoker;
  if ((PromiseData<int> *)local_168._M_invoker != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar3 = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *)
             &((PromiseDataBase<int,_void_(const_int_&)> *)local_168._M_invoker)->super_QSharedData;
    *(int *)&pQVar3->d = *(int *)&pQVar3->d + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0011fa98;
  local_168.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_0011fa68;
  if ((PromiseData<int> *)local_168._M_invoker != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar3 = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *)
             &((PromiseDataBase<int,_void_(const_int_&)> *)local_168._M_invoker)->super_QSharedData;
    *(int *)&pQVar3->d = *(int *)&pQVar3->d + -1;
    UNLOCK();
    if ((*(int *)&pQVar3->d == 0) &&
       ((PromiseData<int> *)local_168._M_invoker != (PromiseData<int> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_168._M_invoker)->_vptr_PromiseDataBase[1]
      )();
    }
  }
  if ((Data *)local_168.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168.super__Function_base._M_functor._8_8_ =
         *(int *)local_168.super__Function_base._M_functor._8_8_ + -1;
    UNLOCK();
    if ((*(int *)local_168.super__Function_base._M_functor._8_8_ == 0) &&
       ((Data *)local_168.super__Function_base._M_functor._8_8_ != (Data *)0x0)) {
      operator_delete((void *)local_168.super__Function_base._M_functor._8_8_,0x10);
    }
  }
  if ((Data *)local_168.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168.super__Function_base._M_functor._M_unused._0_8_ =
         *local_168.super__Function_base._M_functor._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_168.super__Function_base._M_functor._M_unused._M_object == 0) &&
       ((Data *)local_168.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0)) {
      operator_delete(local_168.super__Function_base._M_functor._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (this_01,(function<void_()> *)&resolver);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            (&local_168,(PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_170,
             (QPromiseResolve<int> *)&local_110,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher(this_01,&local_168);
  if ((undefined **)local_168.super__Function_base._M_manager != (undefined **)0x0) {
    (*local_168.super__Function_base._M_manager)
              ((_Any_data *)&local_168,(_Any_data *)&local_168,__destroy_functor);
  }
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_110.d != (Data *)0x0)) {
      operator_delete(local_110.d,0x10);
    }
  }
  if (local_170.d != (Data *)0x0) {
    LOCK();
    ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_170.d != (Data *)0x0)) {
      operator_delete(local_170.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa98;
  bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_01);
  if (!bVar9) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((PromiseDataBase<int,_void_(const_int_&)> *)this_00)->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_c8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((PromiseDataBase<int,_void_(const_int_&)> *)this_00)->_vptr_PromiseDataBase[1])(this_00);
  }
  local_f0.d.d = (Data *)&PTR__QPromiseBase_0011fa68;
  if ((PromiseData<int> *)local_f0.d.ptr != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_f0.d.ptr)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_f0.d.ptr != (PromiseData<int> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_f0.d.ptr)->_vptr_PromiseDataBase[1])();
    }
  }
  QException::~QException((QException *)&local_58);
  LOCK();
  *(int *)plVar4 = (int)*plVar4 + -1;
  UNLOCK();
  if ((int)*plVar4 == 0) {
    (**(code **)(*local_c0 + 8))();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  waitForError<int,QString>(&local_f0,&p,(QString *)&resolver_2);
  QVar16.m_data = (storage_type *)0x3;
  QVar16.m_size = (qsizetype)&local_108;
  QString::fromUtf8(QVar16);
  pp_Var8 = local_108.super_QPromiseBase<int>._vptr_QPromiseBase;
  QVar17.m_data = local_f0.d.ptr;
  QVar17.m_size = local_f0.d.size;
  QVar18.m_data = (storage_type_conflict *)local_108.super_QPromiseBase<int>.m_d.d;
  QVar18.m_size = local_f8;
  cVar10 = QTest::qCompare(QVar17,QVar18,"waitForError(p, QString{})","QString{\"foo\"}",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                           ,0x92);
  if ((QArrayData *)pp_Var8 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)pp_Var8)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)pp_Var8)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)pp_Var8)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pp_Var8,2,8);
    }
  }
  if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,8);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      QArrayData::deallocate((QArrayData *)resolver_2.m_d.d,2,8);
    }
  }
  QVar6.d = p.super_QPromiseBase<int>.m_d.d;
  if (cVar10 != '\0') {
    bVar9 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar9 = (bool)(~bVar9 & ((QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object != (void *)0x0);
    local_108.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(local_108.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,bVar9);
    local_f0.d.d = (Data *)CONCAT71(local_f0.d.d._1_7_,1);
    pcVar14 = QTest::toString<bool>((bool *)&local_108);
    pcVar15 = QTest::toString<bool>((bool *)&local_f0);
    cVar10 = QTest::compare_helper
                       (bVar9,"Compared values are not the same",pcVar14,pcVar15,"p.isRejected()",
                        "true",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                        ,0x93);
    if (cVar10 != '\0') {
      QTest::qVerify(elapsed < 2000,"elapsed < 2000","",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                     ,0x94);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fa68;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_timeout::rejectedStdChrono()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;

    timer.start();

    auto p = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>&,
                                         const QtPromise::QPromiseReject<int>& reject) {
                 QTimer::singleShot(1000, [=]() {
                     reject(QString{"foo"});
                 });
             }}.timeout(std::chrono::seconds{2})
                 .finally([&]() {
                     elapsed = timer.elapsed();
                 });

    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p.isRejected(), true);
    QVERIFY(elapsed < 2000);
}